

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression *
slang::ast::NewArrayExpression::fromSyntax
          (Compilation *compilation,NewArrayExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  bool bVar1;
  Type *pTVar2;
  ExpressionSyntax *pEVar3;
  Expression *pEVar4;
  SourceLocation location;
  NewArrayExpression *expr;
  SourceRange sourceRange;
  Expression *initExpr;
  Expression *local_48;
  Token local_40;
  
  if ((assignmentTarget == (Type *)0x0) ||
     (pTVar2 = Type::getCanonicalType(assignmentTarget),
     (pTVar2->super_Symbol).kind != DynamicArrayType)) {
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    ASTContext::addDiag(context,(DiagCode)0x6b0007,sourceRange);
    pEVar4 = Expression::badExpr(compilation,(Expression *)0x0);
    return pEVar4;
  }
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->sizeExpr);
  pEVar4 = Expression::selfDetermined(compilation,pEVar3,context,(bitmask<slang::ast::ASTFlags>)0x0)
  ;
  local_48 = (Expression *)0x0;
  if (syntax->initializer != (ParenthesizedExpressionSyntax *)0x0) {
    pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->initializer->expression);
    local_40 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax->initializer);
    location = parsing::Token::location(&local_40);
    local_48 = Expression::bindRValue
                         (assignmentTarget,pEVar3,location,context,
                          (bitmask<slang::ast::ASTFlags>)0x0);
  }
  local_40 = (Token)slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::NewArrayExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression_const*&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,assignmentTarget,pEVar4,&local_48,
                    (SourceRange *)&local_40);
  bVar1 = Expression::bad(pEVar4);
  if ((!bVar1) &&
     (((local_48 == (Expression *)0x0 || (bVar1 = Expression::bad(local_48), !bVar1)) &&
      (bVar1 = ASTContext::requireIntegral(context,pEVar4), bVar1)))) {
    return &expr->super_Expression;
  }
  pEVar4 = Expression::badExpr(compilation,&expr->super_Expression);
  return pEVar4;
}

Assistant:

Expression& NewArrayExpression::fromSyntax(Compilation& compilation,
                                           const NewArrayExpressionSyntax& syntax,
                                           const ASTContext& context,
                                           const Type* assignmentTarget) {
    if (!assignmentTarget ||
        assignmentTarget->getCanonicalType().kind != SymbolKind::DynamicArrayType) {
        context.addDiag(diag::NewArrayTarget, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    auto& sizeExpr = selfDetermined(compilation, *syntax.sizeExpr, context);
    const Expression* initExpr = nullptr;
    if (syntax.initializer) {
        initExpr = &bindRValue(*assignmentTarget, *syntax.initializer->expression,
                               syntax.initializer->getFirstToken().location(), context);
    }

    auto result = compilation.emplace<NewArrayExpression>(*assignmentTarget, sizeExpr, initExpr,
                                                          syntax.sourceRange());
    if (sizeExpr.bad() || (initExpr && initExpr->bad()))
        return badExpr(compilation, result);

    if (!context.requireIntegral(sizeExpr))
        return badExpr(compilation, result);

    return *result;
}